

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void VW::add_constant_feature(vw *vw,example *ec)

{
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  size_type in_RSI;
  long in_RDI;
  char (*unaff_retaddr) [9];
  char (*in_stack_00000008) [1];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_00000010;
  uchar *in_stack_ffffffffffffffb8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__p;
  v_array<unsigned_char> *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  feature_value v;
  features *in_stack_ffffffffffffffd0;
  undefined8 local_10;
  undefined8 local_8;
  
  v = (feature_value)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  local_10 = in_RSI;
  local_8 = in_RDI;
  v_array<unsigned_char>::push_back(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  features::push_back(in_stack_ffffffffffffffd0,v,(feature_index)in_stack_ffffffffffffffc0);
  *(float *)(local_10 + 0x68b4) = *(float *)(local_10 + 0x68b4) + 1.0;
  *(long *)(local_10 + 0x68a0) = *(long *)(local_10 + 0x68a0) + 1;
  if (((*(byte *)(local_8 + 0x3438) & 1) != 0) || ((*(byte *)(local_8 + 0x3618) & 1) != 0)) {
    this = (v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)(local_10 + 0x3460);
    operator_new(0x40);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[1],_const_char_(&)[9],_true>
              (in_stack_00000010,in_stack_00000008,unaff_retaddr);
    __p = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&stack0xffffffffffffffe0;
    std::shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>>::
    shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,void>
              ((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this,__p);
    v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back(this,(shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)__p);
    std::
    shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~shared_ptr((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x25df8c);
  }
  return;
}

Assistant:

void add_constant_feature(vw& vw, example* ec)
{
  ec->indices.push_back(constant_namespace);
  ec->feature_space[constant_namespace].push_back(1, constant);
  ec->total_sum_feat_sq++;
  ec->num_features++;
  if (vw.audit || vw.hash_inv)
    ec->feature_space[constant_namespace].space_names.push_back(audit_strings_ptr(new audit_strings("", "Constant")));
}